

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void __thiscall Camera::ProcessKeyboard(Camera *this,Camera_Movement direction,GLfloat deltaTime)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  if (CAM_RIGHT < direction) {
    return;
  }
  fVar4 = deltaTime * this->MovementSpeed;
  switch(direction) {
  case CAM_FORWARD:
    fVar1 = (this->Front).field_2.z;
    uVar5._0_4_ = (this->Position).field_0;
    uVar5._4_4_ = (this->Position).field_1;
    uVar7._0_4_ = (this->Front).field_0;
    uVar7._4_4_ = (this->Front).field_1;
    break;
  case CAM_BACKWARD:
    fVar1 = (this->Front).field_2.z;
    uVar6._0_4_ = (this->Front).field_0;
    uVar6._4_4_ = (this->Front).field_1;
    goto LAB_00114955;
  case CAM_LEFT:
    fVar1 = (this->Right).field_2.z;
    uVar6._0_4_ = (this->Right).field_0;
    uVar6._4_4_ = (this->Right).field_1;
LAB_00114955:
    uVar2 = (this->Position).field_0;
    uVar3 = (this->Position).field_1;
    (this->Position).field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
         ((float)uVar2 - fVar4 * (float)uVar6);
    (this->Position).field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
         ((float)uVar3 - fVar4 * (float)((ulong)uVar6 >> 0x20));
    (this->Position).field_2.z = (this->Position).field_2.z - fVar1 * fVar4;
    return;
  case CAM_RIGHT:
    fVar1 = (this->Right).field_2.z;
    uVar5._0_4_ = (this->Position).field_0;
    uVar5._4_4_ = (this->Position).field_1;
    uVar7._0_4_ = (this->Right).field_0;
    uVar7._4_4_ = (this->Right).field_1;
  }
  (this->Position).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
       (fVar4 * (float)uVar7 + (float)uVar5);
  (this->Position).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (fVar4 * (float)((ulong)uVar7 >> 0x20) + (float)((ulong)uVar5 >> 0x20));
  (this->Position).field_2.z = fVar1 * fVar4 + (this->Position).field_2.z;
  return;
}

Assistant:

void Camera::ProcessKeyboard(Camera_Movement direction, GLfloat deltaTime) {
    GLfloat velocity = MovementSpeed * deltaTime;
    if (direction == CAM_FORWARD) {
        Position += Front * velocity;
    }
    if (direction == CAM_BACKWARD) {
        Position -= Front * velocity;
    }
    if (direction == CAM_LEFT) {
        Position -= Right * velocity;
    }
    if (direction == CAM_RIGHT) {
        Position += Right * velocity;
    }
}